

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<unsigned_int> metaf::WaveHeight::waveHeightFromStateOfSurfaceChar(char c)

{
  if ((byte)(c - 0x30U) < 10) {
    return (optional<unsigned_int>)
           (*(ulong *)(&DAT_00241da0 + (ulong)(byte)(c - 0x30U) * 8) | 0x100000000);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
}

Assistant:

std::optional<unsigned int> WaveHeight::waveHeightFromStateOfSurfaceChar(char c) {
	switch (c) {
		case '0': return maxWaveHeightCalmGlassy;
		case '1': return maxWaveHeightCalmRippled;
		case '2': return maxWaveHeightSmooth;
		case '3': return maxWaveHeightSlight;
		case '4': return maxWaveHeightModerate;
		case '5': return maxWaveHeightRough;
		case '6': return maxWaveHeightVeryRough;
		case '7': return maxWaveHeightHigh;
		case '8': return maxWaveHeightVeryHigh;
		case '9': return minWaveHeightPhenomenal;
		default:  return std::optional<unsigned int>();
	}
}